

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::Randomize(Tensor *val,real scale)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  result_type_conflict2 rVar6;
  undefined1 in_register_00001204 [12];
  uniform_real_distribution<float> distribution;
  uniform_real_distribution<float> local_30;
  
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar2._4_12_ = in_register_00001204;
  auVar2._0_4_ = scale;
  auVar5 = vxorps_avx512vl(auVar2,auVar5);
  local_30._M_param._M_a = auVar5._0_4_;
  pfVar1 = val->v;
  local_30._M_param._M_b = scale;
  uVar3 = Dim::size(&val->d);
  for (lVar4 = 0; (ulong)uVar3 << 2 != lVar4; lVar4 = lVar4 + 4) {
    rVar6 = std::uniform_real_distribution<float>::operator()(&local_30,rndeng);
    *(result_type_conflict2 *)((long)pfVar1 + lVar4) = rVar6;
  }
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& val, real scale) {
  uniform_real_distribution<real> distribution(-scale,scale);
  auto b = [&] {return distribution(*rndeng);};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}